

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O0

void __thiscall Monitor::process(Monitor *this,string *json)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  runtime_error *this_00;
  ostream *poVar5;
  pointer this_01;
  uint uVar6;
  ulong __n;
  void *__buf;
  long in_RDI;
  int in_R8D;
  double dVar7;
  int *ok;
  int *v;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *value;
  key_type *key;
  iterator it;
  stringstream statsd;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  data;
  string error;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffbb8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffbc0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbc8;
  ostream *in_stack_fffffffffffffbd0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffcb8;
  undefined1 allow_exceptions;
  parser_callback_t *in_stack_fffffffffffffcc0;
  input_adapter *in_stack_fffffffffffffcc8;
  string local_2a8 [36];
  int local_284;
  int *local_280;
  int local_274;
  int *local_270;
  int local_268;
  float local_264;
  float local_260;
  float local_25c;
  reference local_258;
  key_type *local_250;
  stringstream local_208 [16];
  ostream local_1f8 [456];
  string local_30 [48];
  
  allow_exceptions = (undefined1)((ulong)in_stack_fffffffffffffcb8 >> 0x38);
  std::__cxx11::string::string(local_30);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)in_stack_fffffffffffffbd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc8);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  __n = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,(bool)allow_exceptions);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)0x196395);
  nlohmann::detail::input_adapter::~input_adapter((input_adapter *)0x1963a2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_208);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin(in_stack_fffffffffffffbc8);
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(in_stack_fffffffffffffbc8);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      if (!bVar1) break;
      local_250 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::key(in_stack_fffffffffffffc00);
      local_258 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::value((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)0x196572);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      if (bVar1) {
        dVar7 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)in_stack_fffffffffffffbc0);
        local_25c = (float)dVar7;
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffbc0,
                   (value_type_conflict2 *)in_stack_fffffffffffffbb8);
        poVar5 = std::operator<<(local_1f8,(string *)local_250);
        poVar5 = std::operator<<(poVar5,":");
        dVar7 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::get<double,_double,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)in_stack_fffffffffffffbc0);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
        poVar5 = std::operator<<(poVar5,"|g");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
        if (bVar1) {
          dVar7 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<double,_double,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)in_stack_fffffffffffffbc0);
          local_260 = (float)dVar7;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffbc0,
                     (value_type_conflict2 *)in_stack_fffffffffffffbb8);
          poVar5 = std::operator<<(local_1f8,(string *)local_250);
          poVar5 = std::operator<<(poVar5,":0|g");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(local_1f8,(string *)local_250);
          poVar5 = std::operator<<(poVar5,":");
          dVar7 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::get<double,_double,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)in_stack_fffffffffffffbc0);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
          poVar5 = std::operator<<(poVar5,"|g");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
          if (bVar1) {
            dVar7 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::get<double,_double,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)in_stack_fffffffffffffbc0);
            local_264 = (float)dVar7;
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffbc0,
                       (value_type_conflict2 *)in_stack_fffffffffffffbb8);
            poVar5 = std::operator<<(local_1f8,(string *)local_250);
            poVar5 = std::operator<<(poVar5,":");
            dVar7 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::get<double,_double,_0>
                              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)in_stack_fffffffffffffbc0);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
            poVar5 = std::operator<<(poVar5,"|g");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
            if (bVar1) {
              local_268 = nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                              *)in_stack_fffffffffffffbc0);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
                         (value_type_conflict3 *)in_stack_fffffffffffffbb8);
              poVar5 = std::operator<<(local_1f8,(string *)local_250);
              poVar5 = std::operator<<(poVar5,":");
              iVar2 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                          *)in_stack_fffffffffffffbc0);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
              poVar5 = std::operator<<(poVar5,"|h");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8
                                     );
              if (bVar1) {
                local_274 = nlohmann::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                                *)in_stack_fffffffffffffbc0);
                local_270 = &local_274;
                if (-1 < local_274) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbd0,
                             (value_type_conflict3 *)in_stack_fffffffffffffbc8);
                  in_stack_fffffffffffffc00 =
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)std::operator<<(local_1f8,(string *)local_250);
                  poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffc00,":");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_270);
                  poVar5 = std::operator<<(poVar5,"|h");
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                }
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffbc0,
                                        (char *)in_stack_fffffffffffffbb8);
                if (bVar1) {
                  local_284 = nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              ::get<int,_int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                                  *)in_stack_fffffffffffffbc0);
                  local_280 = &local_284;
                  if (local_284 == 0) {
                    uVar6 = *(int *)(in_RDI + 0x7c) + 1;
                    __n = (ulong)uVar6;
                    *(uint *)(in_RDI + 0x7c) = uVar6;
                    in_stack_fffffffffffffbc8 =
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)std::operator<<(local_1f8,"packets_ok:0|c");
                    std::ostream::operator<<
                              (in_stack_fffffffffffffbc8,std::endl<char,std::char_traits<char>>);
                    in_stack_fffffffffffffbc0 =
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)std::operator<<(local_1f8,"packets_dropped:1|c");
                    std::ostream::operator<<
                              (in_stack_fffffffffffffbc0,std::endl<char,std::char_traits<char>>);
                  }
                  else {
                    uVar6 = *(int *)(in_RDI + 0x78) + 1;
                    __n = (ulong)uVar6;
                    *(uint *)(in_RDI + 0x78) = uVar6;
                    poVar5 = std::operator<<(local_1f8,"packets_ok:1|c");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    in_stack_fffffffffffffbd0 = std::operator<<(local_1f8,"packets_dropped:0|c");
                    std::ostream::operator<<
                              (in_stack_fffffffffffffbd0,std::endl<char,std::char_traits<char>>);
                  }
                }
              }
            }
          }
        }
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(in_stack_fffffffffffffbc0);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<DatagramSocket,_std::default_delete<DatagramSocket>_> *)0x196d04)
    ;
    if (bVar1) {
      this_01 = std::unique_ptr<DatagramSocket,_std::default_delete<DatagramSocket>_>::operator->
                          ((unique_ptr<DatagramSocket,_std::default_delete<DatagramSocket>_> *)
                           0x196d1e);
      std::__cxx11::stringstream::str();
      DatagramSocket::send(this_01,(int)local_2a8,__buf,__n,in_R8D);
      std::__cxx11::string::~string(local_2a8);
    }
    std::__cxx11::stringstream::~stringstream(local_208);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::~string(local_30);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  this_00 = (runtime_error *)operator_new(0x10);
  std::runtime_error::runtime_error(this_00,local_30);
  *puVar4 = this_00;
  __cxa_throw(puVar4,&std::runtime_error*::typeinfo,0);
}

Assistant:

void Monitor::process(const std::string& json) {
  std::string error;
  auto data = json::parse(json);
  if (!error.empty()) {
    throw new std::runtime_error(error);
  }

  // Accumulate statsd compatible payload
  std::stringstream statsd;

  for (json::iterator it = data.begin(); it != data.end(); ++it) {
    const auto& key = it.key();
    const auto& value = it.value();

    if (key == "gain") {
      stats_.gain.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "frequency") {
      stats_.frequency.push_back(value.get<double>());
      // First set to 0 to support negative values.
      // See: https://github.com/etsy/statsd/blob/master/docs/metric_types.md#gauges
      statsd << key << ":0|g" << std::endl;
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "omega") {
      stats_.omega.push_back(value.get<double>());
      statsd << key << ":" << value.get<double>() << "|g" << std::endl;
      continue;
    }

    if (key == "viterbi_errors") {
      stats_.viterbiErrors.push_back(value.get<int>());
      statsd << key << ":" << value.get<int>() << "|h" << std::endl;
      continue;
    }

    if (key == "reed_solomon_errors") {
      const auto& v = value.get<int>();
      if (v >= 0) {
        stats_.reedSolomonErrors.push_back(v);
        statsd << key << ":" << v << "|h" << std::endl;
      }
      continue;
    }

    if (key == "ok") {
      const auto& ok = value.get<int>();
      if (ok != 0) {
        stats_.totalOK++;
        statsd << "packets_ok:1|c" << std::endl;
        statsd << "packets_dropped:0|c" << std::endl;
      } else {
        stats_.totalDropped++;
        statsd << "packets_ok:0|c" << std::endl;
        statsd << "packets_dropped:1|c" << std::endl;
      }
      continue;
    }
  }

  if (statsd_) {
    statsd_->send(statsd.str());
  }
}